

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O2

GCtab * lj_lib_checktabornil(lua_State *L,int narg)

{
  int iVar1;
  TValue *pTVar2;
  
  pTVar2 = L->base + (long)narg + -1;
  if (pTVar2 < L->top) {
    iVar1 = *(int *)((long)L->base + (long)narg * 8 + -4);
    if (iVar1 == -1) {
      return (GCtab *)0x0;
    }
    if (iVar1 == -0xc) {
      return (GCtab *)(ulong)(pTVar2->u32).lo;
    }
  }
  lj_err_arg(L,narg,LJ_ERR_NOTABN);
}

Assistant:

GCtab *lj_lib_checktabornil(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (o < L->top) {
    if (tvistab(o))
      return tabV(o);
    else if (tvisnil(o))
      return NULL;
  }
  lj_err_arg(L, narg, LJ_ERR_NOTABN);
  return NULL;  /* unreachable */
}